

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void WindowSettingsHandler_WriteAll
               (ImGuiContext *ctx,ImGuiSettingsHandler *handler,ImGuiTextBuffer *buf)

{
  int iVar1;
  ImGuiWindow **ppIVar2;
  ImGuiWindowSettings *this;
  ImGuiWindowSettings *p;
  ImGuiTextBuffer *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  ImVec2 IVar3;
  char *settings_name;
  ImGuiWindowSettings *settings_1;
  ImGuiWindowSettings *settings;
  ImGuiWindow *window;
  int i;
  ImGuiContext *g;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  ImGuiTextBuffer *this_00;
  ImGuiWindowSettings *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffb0;
  ImVec2ih in_stack_ffffffffffffffb4;
  ImVec2ih in_stack_ffffffffffffffb8;
  float in_stack_ffffffffffffffbc;
  float in_stack_ffffffffffffffc0;
  ImVec2ih in_stack_ffffffffffffffc4;
  ImGuiWindowSettings *local_38;
  ImGuiWindow *name;
  int local_24;
  
  for (local_24 = 0; local_24 != *(int *)(in_RDI + 0x1ad8); local_24 = local_24 + 1) {
    ppIVar2 = ImVector<ImGuiWindow_*>::operator[]
                        ((ImVector<ImGuiWindow_*> *)(in_RDI + 0x1ad8),local_24);
    name = *ppIVar2;
    if ((name->Flags & 0x100U) == 0) {
      if (name->SettingsOffset == -1) {
        in_stack_ffffffffffffff98 =
             ImGui::FindWindowSettings((ImGuiID)((ulong)in_stack_ffffffffffffff98 >> 0x20));
      }
      else {
        in_stack_ffffffffffffff98 =
             ImChunkStream<ImGuiWindowSettings>::ptr_from_offset
                       ((ImChunkStream<ImGuiWindowSettings> *)(in_RDI + 0x2ef0),name->SettingsOffset
                       );
      }
      local_38 = in_stack_ffffffffffffff98;
      if (in_stack_ffffffffffffff98 == (ImGuiWindowSettings *)0x0) {
        local_38 = ImGui::CreateNewWindowSettings((char *)name);
        iVar1 = ImChunkStream<ImGuiWindowSettings>::offset_from_ptr
                          ((ImChunkStream<ImGuiWindowSettings> *)(in_RDI + 0x2ef0),local_38);
        name->SettingsOffset = iVar1;
      }
      IVar3 = operator-((ImVec2 *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                        (ImVec2 *)0x1b35bd);
      in_stack_ffffffffffffffbc = IVar3.x;
      in_stack_ffffffffffffffc0 = IVar3.y;
      ImVec2ih::ImVec2ih((ImVec2ih *)&stack0xffffffffffffffc4,(ImVec2 *)&stack0xffffffffffffffbc);
      local_38->Pos = in_stack_ffffffffffffffc4;
      ImVec2ih::ImVec2ih((ImVec2ih *)&stack0xffffffffffffffb8,&name->SizeFull);
      local_38->Size = in_stack_ffffffffffffffb8;
      local_38->ViewportId = name->ViewportId;
      ImVec2ih::ImVec2ih((ImVec2ih *)&stack0xffffffffffffffb4,&name->ViewportPos);
      local_38->ViewportPos = in_stack_ffffffffffffffb4;
      local_38->DockId = name->DockId;
      local_38->ClassId = (name->WindowClass).ClassId;
      local_38->DockOrder = name->DockOrder;
      local_38->Collapsed = (bool)(name->Collapsed & 1);
    }
  }
  this_00 = in_RDX;
  iVar1 = ImGuiTextBuffer::size(in_RDX);
  ImChunkStream<ImGuiWindowSettings>::size((ImChunkStream<ImGuiWindowSettings> *)(in_RDI + 0x2ef0));
  ImGuiTextBuffer::reserve(this_00,iVar1);
  for (this = ImChunkStream<ImGuiWindowSettings>::begin
                        ((ImChunkStream<ImGuiWindowSettings> *)(in_RDI + 0x2ef0));
      this != (ImGuiWindowSettings *)0x0;
      this = ImChunkStream<ImGuiWindowSettings>::next_chunk
                       ((ImChunkStream<ImGuiWindowSettings> *)this,p)) {
    p = (ImGuiWindowSettings *)ImGuiWindowSettings::GetName(this);
    ImGuiTextBuffer::appendf(in_RDX,"[%s][%s]\n",*in_RSI,p);
    if ((this->ViewportId != 0) && (this->ViewportId != 0x11111111)) {
      ImGuiTextBuffer::appendf
                (in_RDX,"ViewportPos=%d,%d\n",(ulong)(uint)(int)(this->ViewportPos).x,
                 (ulong)(uint)(int)(this->ViewportPos).y);
      ImGuiTextBuffer::appendf(in_RDX,"ViewportId=0x%08X\n",(ulong)this->ViewportId);
    }
    if ((((this->Pos).x != 0) || ((this->Pos).y != 0)) || (this->ViewportId == 0x11111111)) {
      ImGuiTextBuffer::appendf
                (in_RDX,"Pos=%d,%d\n",(ulong)(uint)(int)(this->Pos).x,
                 (ulong)(uint)(int)(this->Pos).y);
    }
    if (((this->Size).x != 0) || ((this->Size).y != 0)) {
      ImGuiTextBuffer::appendf
                (in_RDX,"Size=%d,%d\n",(ulong)(uint)(int)(this->Size).x,
                 (ulong)(uint)(int)(this->Size).y);
    }
    ImGuiTextBuffer::appendf(in_RDX,"Collapsed=%d\n",(ulong)(this->Collapsed & 1));
    if (this->DockId != 0) {
      if (this->DockOrder == -1) {
        ImGuiTextBuffer::appendf(in_RDX,"DockId=0x%08X\n",(ulong)this->DockId);
      }
      else {
        ImGuiTextBuffer::appendf
                  (in_RDX,"DockId=0x%08X,%d\n",(ulong)this->DockId,(ulong)(uint)(int)this->DockOrder
                  );
      }
      if (this->ClassId != 0) {
        ImGuiTextBuffer::appendf(in_RDX,"ClassId=0x%08X\n",(ulong)this->ClassId);
      }
    }
    ImGuiTextBuffer::append
              ((ImGuiTextBuffer *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
               (char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  }
  return;
}

Assistant:

static void WindowSettingsHandler_WriteAll(ImGuiContext* ctx, ImGuiSettingsHandler* handler, ImGuiTextBuffer* buf)
{
    // Gather data from windows that were active during this session
    // (if a window wasn't opened in this session we preserve its settings)
    ImGuiContext& g = *ctx;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Flags & ImGuiWindowFlags_NoSavedSettings)
            continue;

        ImGuiWindowSettings* settings = (window->SettingsOffset != -1) ? g.SettingsWindows.ptr_from_offset(window->SettingsOffset) : ImGui::FindWindowSettings(window->ID);
        if (!settings)
        {
            settings = ImGui::CreateNewWindowSettings(window->Name);
            window->SettingsOffset = g.SettingsWindows.offset_from_ptr(settings);
        }
        IM_ASSERT(settings->ID == window->ID);
        settings->Pos = ImVec2ih(window->Pos - window->ViewportPos);
        settings->Size = ImVec2ih(window->SizeFull);
        settings->ViewportId = window->ViewportId;
        settings->ViewportPos = ImVec2ih(window->ViewportPos);
        IM_ASSERT(window->DockNode == NULL || window->DockNode->ID == window->DockId);
        settings->DockId = window->DockId;
        settings->ClassId = window->WindowClass.ClassId;
        settings->DockOrder = window->DockOrder;
        settings->Collapsed = window->Collapsed;
    }

    // Write to text buffer
    buf->reserve(buf->size() + g.SettingsWindows.size() * 6); // ballpark reserve
    for (ImGuiWindowSettings* settings = g.SettingsWindows.begin(); settings != NULL; settings = g.SettingsWindows.next_chunk(settings))
    {
        const char* settings_name = settings->GetName();
        buf->appendf("[%s][%s]\n", handler->TypeName, settings_name);
        if (settings->ViewportId != 0 && settings->ViewportId != ImGui::IMGUI_VIEWPORT_DEFAULT_ID)
        {
            buf->appendf("ViewportPos=%d,%d\n", settings->ViewportPos.x, settings->ViewportPos.y);
            buf->appendf("ViewportId=0x%08X\n", settings->ViewportId);
        }
        if (settings->Pos.x != 0 || settings->Pos.y != 0 || settings->ViewportId == ImGui::IMGUI_VIEWPORT_DEFAULT_ID)
            buf->appendf("Pos=%d,%d\n", settings->Pos.x, settings->Pos.y);
        if (settings->Size.x != 0 || settings->Size.y != 0)
            buf->appendf("Size=%d,%d\n", settings->Size.x, settings->Size.y);
        buf->appendf("Collapsed=%d\n", settings->Collapsed);
        if (settings->DockId != 0)
        {
            // Write DockId as 4 digits if possible. Automatic DockId are small numbers, but full explicit DockSpace() are full ImGuiID range.
            if (settings->DockOrder == -1)
                buf->appendf("DockId=0x%08X\n", settings->DockId);
            else
                buf->appendf("DockId=0x%08X,%d\n", settings->DockId, settings->DockOrder);
            if (settings->ClassId != 0)
                buf->appendf("ClassId=0x%08X\n", settings->ClassId);
        }
        buf->append("\n");
    }
}